

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::NumericToHugeDecimalCast<unsigned_long>
               (unsigned_long input,hugeint_t *result,CastParameters *parameters,uint8_t width,
               uint8_t scale)

{
  bool bVar1;
  byte in_CL;
  long lVar2;
  uint64_t *in_RSI;
  byte in_R8B;
  hugeint_t hVar3;
  string error;
  hugeint_t hinput;
  hugeint_t max_width;
  CastParameters *in_stack_ffffffffffffff08;
  hugeint_t *in_stack_ffffffffffffff10;
  string *error_message;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff20 [16];
  hugeint_t *rhs;
  hugeint_t *in_stack_ffffffffffffff30;
  uchar in_stack_ffffffffffffff5e;
  uchar in_stack_ffffffffffffff5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string asStack_78 [32];
  hugeint_t hStack_58;
  hugeint_t hStack_48;
  undefined8 uStack_38;
  undefined8 uStack_30;
  uint64_t *puStack_18;
  byte bStack_1;
  
  rhs = in_stack_ffffffffffffff20._8_8_;
  lVar2 = (long)(int)((uint)in_CL - (uint)in_R8B) * 0x10;
  uStack_38 = *(undefined8 *)(Hugeint::POWERS_OF_TEN + lVar2);
  uStack_30 = *(undefined8 *)(Hugeint::POWERS_OF_TEN + lVar2 + 8);
  puStack_18 = in_RSI;
  hStack_48 = Hugeint::Convert<unsigned_long>(in_stack_ffffffffffffff20._0_8_);
  bVar1 = hugeint_t::operator>=(in_stack_ffffffffffffff30,rhs);
  uVar4 = true;
  if (!bVar1) {
    hStack_58 = hugeint_t::operator-(in_stack_ffffffffffffff10);
    uVar4 = hugeint_t::operator<=(in_stack_ffffffffffffff30,rhs);
  }
  if ((bool)uVar4 == false) {
    hVar3 = hugeint_t::operator*((hugeint_t *)in_stack_ffffffffffffff08,(hugeint_t *)0x2b151de);
    *puStack_18 = hVar3.lower;
    puStack_18[1] = hVar3.upper;
    bStack_1 = 1;
  }
  else {
    error_message = (string *)&stack0xffffffffffffff67;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff68,"Could not cast value %s to DECIMAL(%d,%d)",
               (allocator *)error_message);
    hugeint_t::ToString((hugeint_t *)CONCAT17(uVar4,in_stack_ffffffffffffff18));
    StringUtil::
    Format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_unsigned_char>
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f,
               in_stack_ffffffffffffff5e);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    HandleCastError::AssignError(error_message,in_stack_ffffffffffffff08);
    bStack_1 = 0;
    ::std::__cxx11::string::~string(asStack_78);
  }
  return (bool)(bStack_1 & 1);
}

Assistant:

bool NumericToHugeDecimalCast(SRC input, hugeint_t &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	hugeint_t max_width = Hugeint::POWERS_OF_TEN[width - scale];
	hugeint_t hinput = Hugeint::Convert(input);
	if (hinput >= max_width || hinput <= -max_width) {
		string error = StringUtil::Format("Could not cast value %s to DECIMAL(%d,%d)", hinput.ToString(), width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = hinput * Hugeint::POWERS_OF_TEN[scale];
	return true;
}